

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswIslands.c
# Opt level: O3

Aig_Man_t *
Ssw_SecWithSimilaritySweep(Aig_Man_t *p0,Aig_Man_t *p1,Vec_Int_t *vPairs,Ssw_Pars_t *pPars)

{
  Vec_Int_t *vPairsAll;
  Aig_Man_t *pMiter;
  Vec_Int_t *vPairs_00;
  Ssw_Man_t *p;
  Ssw_Cla_t *pSVar1;
  Aig_Man_t *pAVar2;
  Ssw_Sml_t *pManData;
  int level;
  
  Ssw_MatchingStart(p0,p1,vPairs);
  if (pPars->nIsleDist != 0) {
    Ssw_MatchingExtend(p0,p1,pPars->nIsleDist,pPars->fVerbose);
  }
  Ssw_MatchingComplete(p0,p1);
  Ssw_MatchingComplete(p1,p0);
  vPairsAll = Ssw_MatchingPairs(p0,p1);
  pMiter = Saig_ManCreateMiter(p0,p1,0);
  vPairs_00 = Ssw_MatchingMiter(pMiter,p0,p1,vPairsAll);
  if (vPairsAll->pArray != (int *)0x0) {
    free(vPairsAll->pArray);
  }
  free(vPairsAll);
  p = Ssw_ManCreate(pMiter,pPars);
  if (p->pPars->fPartSigCorr == 0) {
    pAVar2 = pMiter;
    pSVar1 = Ssw_ClassesPrepare(pMiter,pPars->nFramesK,pPars->fLatchCorr,pPars->fConstCorr,
                                pPars->fOutputCorr,pPars->nMaxLevs,pPars->fVerbose);
    level = (int)pAVar2;
  }
  else {
    pAVar2 = pMiter;
    pSVar1 = Ssw_ClassesPreparePairsSimple(pMiter,vPairs_00);
    level = (int)pAVar2;
  }
  p->ppClasses = pSVar1;
  if (p->pPars->fDumpSRInit != 0) {
    if (p->pPars->fPartSigCorr == 0) {
      Abc_Print(level,
                "Dumping speculative miter is possible only for partial signal correspondence (switch \"-c\").\n"
               );
    }
    else {
      pAVar2 = Ssw_SpeculativeReduction(p);
      Aig_ManDumpBlif(pAVar2,"srm_part.blif",(Vec_Ptr_t *)0x0,(Vec_Ptr_t *)0x0);
      Aig_ManStop(pAVar2);
      Abc_Print((int)pAVar2,"Speculatively reduced miter is saved in file \"%s\".\n","srm_part.blif"
               );
    }
  }
  pManData = Ssw_SmlStart(pMiter,0,p->pPars->nFramesAddSim + 1,1);
  p->pSml = pManData;
  Ssw_ClassesSetData(p->ppClasses,pManData,Ssw_SmlObjHashWord,Ssw_SmlObjIsConstWord,
                     Ssw_SmlObjsAreEqualWord);
  pAVar2 = Ssw_SignalCorrespondenceRefine(p);
  Ssw_ManStop(p);
  Aig_ManStop(pMiter);
  if (vPairs_00->pArray != (int *)0x0) {
    free(vPairs_00->pArray);
  }
  free(vPairs_00);
  return pAVar2;
}

Assistant:

Aig_Man_t * Ssw_SecWithSimilaritySweep( Aig_Man_t * p0, Aig_Man_t * p1, Vec_Int_t * vPairs, Ssw_Pars_t * pPars )
{
    Ssw_Man_t * p;
    Vec_Int_t * vPairsAll, * vPairsMiter;
    Aig_Man_t * pMiter, * pAigNew;
    // derive full matching
    Ssw_MatchingStart( p0, p1, vPairs );
    if ( pPars->nIsleDist )
        Ssw_MatchingExtend( p0, p1, pPars->nIsleDist, pPars->fVerbose );
    Ssw_MatchingComplete( p0, p1 );
    Ssw_MatchingComplete( p1, p0 );
    vPairsAll = Ssw_MatchingPairs( p0, p1 );
    // create miter and transfer matching
    pMiter = Saig_ManCreateMiter( p0, p1, 0 );
    vPairsMiter = Ssw_MatchingMiter( pMiter, p0, p1, vPairsAll );
    Vec_IntFree( vPairsAll );
    // start the induction manager
    p = Ssw_ManCreate( pMiter, pPars );
    // create equivalence classes using these IDs
    if ( p->pPars->fPartSigCorr )
        p->ppClasses = Ssw_ClassesPreparePairsSimple( pMiter, vPairsMiter );
    else
        p->ppClasses = Ssw_ClassesPrepare( pMiter, pPars->nFramesK, pPars->fLatchCorr, pPars->fConstCorr, pPars->fOutputCorr, pPars->nMaxLevs, pPars->fVerbose );
    if ( p->pPars->fDumpSRInit )
    {
        if ( p->pPars->fPartSigCorr )
        {
            Aig_Man_t * pSRed = Ssw_SpeculativeReduction( p );
            Aig_ManDumpBlif( pSRed, "srm_part.blif", NULL, NULL );
            Aig_ManStop( pSRed );
            Abc_Print( 1, "Speculatively reduced miter is saved in file \"%s\".\n", "srm_part.blif" );
        }
        else
            Abc_Print( 1, "Dumping speculative miter is possible only for partial signal correspondence (switch \"-c\").\n" );
    }
    p->pSml = Ssw_SmlStart( pMiter, 0, 1 + p->pPars->nFramesAddSim, 1 );
    Ssw_ClassesSetData( p->ppClasses, p->pSml, (unsigned(*)(void *,Aig_Obj_t *))Ssw_SmlObjHashWord, (int(*)(void *,Aig_Obj_t *))Ssw_SmlObjIsConstWord, (int(*)(void *,Aig_Obj_t *,Aig_Obj_t *))Ssw_SmlObjsAreEqualWord );
    // perform refinement of classes
    pAigNew = Ssw_SignalCorrespondenceRefine( p );
    // cleanup
    Ssw_ManStop( p );
    Aig_ManStop( pMiter );
    Vec_IntFree( vPairsMiter );
    return pAigNew;
}